

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

void kj::UnixEventPort::registerSignalHandler(int signum)

{
  int iVar1;
  Fault f_4;
  Fault f_1;
  Fault f;
  sigset_t mask;
  Fault local_140;
  Fault local_138;
  undefined8 uStack_130;
  _union_1457 local_128;
  sigset_t sStack_120;
  undefined4 local_a0;
  sigset_t local_90;
  
  if (((uint)signum < 0xc) && ((0x990U >> (signum & 0x1fU) & 1) != 0)) {
    local_90.__val[0]._0_1_ = 0;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[93]>
              ((Fault *)&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xba,FAILED,
               "signum != SIGBUS && signum != SIGFPE && signum != SIGILL && signum != SIGSEGV",
               "_kjCondition,\"this signal is raised by erroneous code execution; you cannot capture it into the event \" \"loop\""
               ,(bool *)&local_90,
               (char (*) [93])
               "this signal is raised by erroneous code execution; you cannot capture it into the event loop"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_128);
  }
  (anonymous_namespace)::tooLateToSetReserved = 1;
  do {
    iVar1 = sigemptyset(&local_90);
    if (-1 < iVar1) goto LAB_00498da6;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_138.exception = (Exception *)0x0;
    local_128.sa_handler = (__sighandler_t)0x0;
    sStack_120.__val[0] = 0;
    kj::_::Debug::Fault::init
              (&local_138,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_138);
  }
LAB_00498da6:
  do {
    iVar1 = sigaddset(&local_90,signum);
    if (-1 < iVar1) goto LAB_00498dcd;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_138.exception = (Exception *)0x0;
    local_128.sa_handler = (__sighandler_t)0x0;
    sStack_120.__val[0] = 0;
    kj::_::Debug::Fault::init
              (&local_138,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_138);
  }
LAB_00498dcd:
  do {
    iVar1 = pthread_sigmask(0,&local_90,(__sigset_t *)0x0);
    if (-1 < iVar1) goto LAB_00498df6;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_138.exception = (Exception *)0x0;
    local_128.sa_handler = (__sighandler_t)0x0;
    sStack_120.__val[0] = 0;
    kj::_::Debug::Fault::init
              (&local_138,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_138);
  }
LAB_00498df6:
  memset(&sStack_120,0,0x90);
  local_128.sa_handler = signalHandler;
  local_a0 = 4;
  do {
    iVar1 = sigfillset(&sStack_120);
    if (-1 < iVar1) goto LAB_00498e40;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_140.exception = (Exception *)0x0;
    local_138.exception = (Exception *)0x0;
    uStack_130 = 0;
    kj::_::Debug::Fault::init
              (&local_140,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_140);
  }
LAB_00498e40:
  do {
    iVar1 = sigdelset(&sStack_120,7);
    if (-1 < iVar1) goto LAB_00498e65;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_140.exception = (Exception *)0x0;
    local_138.exception = (Exception *)0x0;
    uStack_130 = 0;
    kj::_::Debug::Fault::init
              (&local_140,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_140);
  }
LAB_00498e65:
  do {
    iVar1 = sigdelset(&sStack_120,8);
    if (-1 < iVar1) goto LAB_00498e8a;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_140.exception = (Exception *)0x0;
    local_138.exception = (Exception *)0x0;
    uStack_130 = 0;
    kj::_::Debug::Fault::init
              (&local_140,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_140);
  }
LAB_00498e8a:
  do {
    iVar1 = sigdelset(&sStack_120,4);
    if (-1 < iVar1) goto LAB_00498eaf;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_140.exception = (Exception *)0x0;
    local_138.exception = (Exception *)0x0;
    uStack_130 = 0;
    kj::_::Debug::Fault::init
              (&local_140,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_140);
  }
LAB_00498eaf:
  do {
    iVar1 = sigdelset(&sStack_120,0xb);
    if (-1 < iVar1) goto LAB_00498ed4;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_140.exception = (Exception *)0x0;
    local_138.exception = (Exception *)0x0;
    uStack_130 = 0;
    kj::_::Debug::Fault::init
              (&local_140,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
              );
    kj::_::Debug::Fault::fatal(&local_140);
  }
LAB_00498ed4:
  do {
    iVar1 = sigaction(signum,(sigaction *)&local_128,(sigaction *)0x0);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  local_140.exception = (Exception *)0x0;
  local_138.exception = (Exception *)0x0;
  uStack_130 = 0;
  kj::_::Debug::Fault::init
            (&local_140,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_140);
}

Assistant:

void UnixEventPort::registerSignalHandler(int signum) {
  KJ_REQUIRE(signum != SIGBUS && signum != SIGFPE && signum != SIGILL && signum != SIGSEGV,
      "this signal is raised by erroneous code execution; you cannot capture it into the event "
      "loop");

  tooLateToSetReserved = true;

  // Block the signal from being delivered most of the time. We'll explicitly unblock it when we
  // want to receive it.
  sigset_t mask;
  KJ_SYSCALL(sigemptyset(&mask));
  KJ_SYSCALL(sigaddset(&mask, signum));
  KJ_SYSCALL(pthread_sigmask(SIG_BLOCK, &mask, nullptr));

  // Register the signal handler which should be invoked when we explicitly unblock the signal.
  struct sigaction action;
  memset(&action, 0, sizeof(action));
  action.sa_sigaction = &signalHandler;
  action.sa_flags = SA_SIGINFO;

  // Set up the signal mask applied while the signal handler runs. We want to block all other
  // signals from being raised during the handler, with the exception of the four "crash" signals,
  // which realistically can't be blocked.
  KJ_SYSCALL(sigfillset(&action.sa_mask));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGBUS));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGFPE));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGILL));
  KJ_SYSCALL(sigdelset(&action.sa_mask, SIGSEGV));

  KJ_SYSCALL(sigaction(signum, &action, nullptr));
}